

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelOverridesProperties::IfcRelOverridesProperties
          (IfcRelOverridesProperties *this)

{
  *(undefined ***)&this->field_0x100 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x108 = 0;
  *(char **)&this->field_0x110 = "IfcRelOverridesProperties";
  IfcRelDefinesByProperties::IfcRelDefinesByProperties
            (&this->super_IfcRelDefinesByProperties,&PTR_construction_vtable_24__008a13c8);
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).field_0xe0 = 0;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = 0x8a12e8;
  *(undefined8 *)&this->field_0x100 = 0x8a13b0;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = 0x8a1310;
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8a1338;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 = 0x8a1360;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).field_0xd8 = 0x8a1388;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).field_0xe8 = 0;
  *(undefined8 *)&this->field_0xf0 = 0;
  *(undefined8 *)&this->field_0xf8 = 0;
  return;
}

Assistant:

IfcRelOverridesProperties() : Object("IfcRelOverridesProperties") {}